

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

void StoreLevelStats(void)

{
  OneLevel *pOVar1;
  undefined1 auVar2 [16];
  FString __s2;
  int iVar3;
  int iVar4;
  OneLevel *pOVar5;
  uint uVar6;
  int iVar7;
  DThinker *pDVar8;
  uint uVar9;
  ulong uVar10;
  FString *pFVar11;
  ulong uVar12;
  TThinkerIterator<AActor> it;
  FThinkerIterator FStack_48;
  
  uVar6 = LevelData.Count;
  __s2.Chars = level.MapName.Chars;
  if (gamestate != GS_LEVEL) {
    return;
  }
  if ((level.flags2._3_1_ & 0x10) != 0) {
    return;
  }
  uVar12 = (ulong)LevelData.Count;
  if (uVar12 == 0) {
    uVar10 = 0;
LAB_00487ca0:
    uVar9 = (uint)uVar10;
    if (uVar9 != uVar6) goto LAB_00487cd2;
  }
  else {
    pFVar11 = &(LevelData.Array)->Levelname;
    uVar10 = 0;
    do {
      iVar7 = strcasecmp(pFVar11->Chars,__s2.Chars);
      if (iVar7 == 0) goto LAB_00487ca0;
      uVar10 = uVar10 + 1;
      pFVar11 = pFVar11 + 4;
      uVar9 = uVar6;
    } while (uVar12 != uVar10);
  }
  TArray<OneLevel,_OneLevel>::Reserve(&LevelData,1);
  FString::operator=(&LevelData.Array[uVar12].Levelname,&level.MapName);
LAB_00487cd2:
  pOVar5 = LevelData.Array;
  iVar4 = level.killed_monsters;
  iVar3 = level.found_secrets;
  iVar7 = level.total_secrets;
  pOVar1 = LevelData.Array + uVar9;
  pOVar1->totalkills = level.total_monsters;
  pOVar1->killcount = iVar4;
  pOVar1->totalsecrets = iVar7;
  pOVar1->secretcount = iVar3;
  auVar2 = SEXT816((long)level.maptime * 0x62) * ZEXT816(0xa3d70a3d70a3d70b);
  pOVar5[uVar9].leveltime = (int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f);
  FThinkerIterator::FThinkerIterator(&FStack_48,AActor::RegistrationInfo.MyClass,0x80);
  iVar7 = 0;
  pDVar8 = FThinkerIterator::Next(&FStack_48,false);
  if (pDVar8 != (DThinker *)0x0) {
    do {
      if (((ulong)pDVar8[7].PrevThinker & 0x40000000000000) != 0) {
        iVar7 = iVar7 + (uint)(0 < *(int *)((long)&pDVar8[9].super_DObject._vptr_DObject + 4));
      }
      pDVar8 = FThinkerIterator::Next(&FStack_48,false);
    } while (pDVar8 != (DThinker *)0x0);
    if (iVar7 != 0) {
      return;
    }
  }
  LevelData.Array[uVar9].killcount = LevelData.Array[uVar9].totalkills;
  return;
}

Assistant:

static void StoreLevelStats()
{
	unsigned int i;

	if (gamestate != GS_LEVEL) return;

	if (!(level.flags2&LEVEL2_NOSTATISTICS))	// don't consider maps that were excluded from statistics
	{
		for(i=0;i<LevelData.Size();i++)
		{
			if (!LevelData[i].Levelname.CompareNoCase(level.MapName)) break;
		}
		if (i==LevelData.Size())
		{
			LevelData.Reserve(1);
			LevelData[i].Levelname = level.MapName;
		}
		LevelData[i].totalkills = level.total_monsters;
		LevelData[i].killcount = level.killed_monsters;
		LevelData[i].totalsecrets = level.total_secrets;
		LevelData[i].secretcount = level.found_secrets;
		LevelData[i].leveltime = AdjustTics(level.maptime);

		// Check for living monsters. On some maps it can happen
		// that the counter misses some. 
		TThinkerIterator<AActor> it;
		AActor *ac;
		int mc = 0;

		while ((ac = it.Next()))
		{
			if ((ac->flags & MF_COUNTKILL) && ac->health > 0) mc++;
		}
		if (mc == 0) LevelData[i].killcount = LevelData[i].totalkills;
	}
}